

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puthread.c
# Opt level: O2

PUThread * p_uthread_current(void)

{
  PUThread *value;
  
  value = (PUThread *)p_uthread_get_local(pp_uthread_specific_data);
  if (value == (PUThread *)0x0) {
    value = (PUThread *)p_malloc0(0x30);
    if (value == (PUThread *)0x0) {
      value = (PUThread *)0x0;
      printf("** Error: %s **\n","PUThread::p_uthread_current: failed to allocate memory");
    }
    else {
      (value->base).ref_count = 1;
      p_uthread_set_local(pp_uthread_specific_data,value);
    }
  }
  return value;
}

Assistant:

P_LIB_API PUThread *
p_uthread_current (void)
{
	PUThreadBase *base_thread = p_uthread_get_local (pp_uthread_specific_data);

	if (P_UNLIKELY (base_thread == NULL)) {
		if (P_UNLIKELY ((base_thread = p_malloc0 (sizeof (PUThreadBase))) == NULL)) {
			P_ERROR ("PUThread::p_uthread_current: failed to allocate memory");
			return NULL;
		}

		base_thread->ref_count = 1;

		p_uthread_set_local (pp_uthread_specific_data, base_thread);
	}

	return (PUThread *) base_thread;
}